

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakebuiltins.cpp
# Opt level: O0

QString * __thiscall QMakeEvaluator::filePathEnvArg0(QMakeEvaluator *this,ProStringList *args)

{
  QMakeGlobals *in_RDX;
  long in_RSI;
  ProString *in_RDI;
  long in_FS_OFFSET;
  QString *fn;
  ProStringRoUser u1;
  QList<ProString> *in_stack_ffffffffffffffa0;
  QString *this_00;
  ProString *fileName;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  ProStringRoUser local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.m_rs = (QString *)0xaaaaaaaaaaaaaaaa;
  fileName = in_RDI;
  QList<ProString>::at(in_stack_ffffffffffffffa0,(qsizetype)in_RDI);
  ProStringRoUser::ProStringRoUser
            ((ProStringRoUser *)in_stack_ffffffffffffffa0,in_RDI,(QString *)0x2c853e);
  uVar1 = 0;
  (fileName->m_string).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  (fileName->m_string).d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (fileName->m_string).d.size = -0x5555555555555556;
  this_00 = *(QString **)(in_RSI + 0x290);
  ProStringRoUser::str(&local_10);
  QMakeGlobals::expandEnvVars(in_RDX,(QString *)CONCAT17(uVar1,in_stack_ffffffffffffffb8));
  resolvePath((QMakeEvaluator *)CONCAT17(uVar1,in_stack_ffffffffffffffb8),&fileName->m_string);
  QString::~QString((QString *)0x2c85b3);
  QString::detach(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return &in_RDI->m_string;
}

Assistant:

QString QMakeEvaluator::filePathEnvArg0(const ProStringList &args)
{
    ProStringRoUser u1(args.at(0), m_tmp1);
    QString fn = resolvePath(m_option->expandEnvVars(u1.str()));
    fn.detach();
    return fn;
}